

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O2

void __thiscall wasm::EffectAnalyzer::EffectAnalyzer(EffectAnalyzer *this,EffectAnalyzer *param_1)

{
  Module *pMVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined4 uVar15;
  
  bVar3 = param_1->trapsNeverHappen;
  this->ignoreImplicitTraps = param_1->ignoreImplicitTraps;
  this->trapsNeverHappen = bVar3;
  std::
  __shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&(this->funcEffectsMap).
                  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ,&(param_1->funcEffectsMap).
                   super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  pMVar1 = param_1->module;
  *(undefined8 *)((long)&this->module + 6) = *(undefined8 *)((long)&param_1->module + 6);
  this->module = pMVar1;
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_Rb_tree(&(this->localsRead)._M_t,&(param_1->localsRead)._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_Rb_tree(&(this->localsWritten)._M_t,&(param_1->localsWritten)._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::_Rb_tree(&(this->mutableGlobalsRead)._M_t,&(param_1->mutableGlobalsRead)._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::_Rb_tree(&(this->globalsWritten)._M_t,&(param_1->globalsWritten)._M_t);
  this->danglingPop = param_1->danglingPop;
  bVar3 = param_1->readsMemory;
  bVar4 = param_1->writesMemory;
  bVar5 = param_1->readsTable;
  bVar6 = param_1->writesTable;
  bVar7 = param_1->readsMutableStruct;
  bVar8 = param_1->writesStruct;
  bVar9 = param_1->readsArray;
  bVar10 = param_1->writesArray;
  bVar11 = param_1->trap;
  bVar12 = param_1->implicitTrap;
  bVar13 = param_1->isAtomic;
  bVar14 = param_1->throws_;
  uVar15 = *(undefined4 *)&param_1->field_0xf4;
  sVar2 = param_1->catchDepth;
  this->tryDepth = param_1->tryDepth;
  this->catchDepth = sVar2;
  this->readsMemory = bVar3;
  this->writesMemory = bVar4;
  this->readsTable = bVar5;
  this->writesTable = bVar6;
  this->readsMutableStruct = bVar7;
  this->writesStruct = bVar8;
  this->readsArray = bVar9;
  this->writesArray = bVar10;
  this->trap = bVar11;
  this->implicitTrap = bVar12;
  this->isAtomic = bVar13;
  this->throws_ = bVar14;
  *(undefined4 *)&this->field_0xf4 = uVar15;
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::_Rb_tree(&(this->breakTargets)._M_t,&(param_1->breakTargets)._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::_Rb_tree(&(this->delegateTargets)._M_t,&(param_1->delegateTargets)._M_t);
  return;
}

Assistant:

EffectAnalyzer(const PassOptions& passOptions, Module& module)
    : ignoreImplicitTraps(passOptions.ignoreImplicitTraps),
      trapsNeverHappen(passOptions.trapsNeverHappen),
      funcEffectsMap(passOptions.funcEffectsMap), module(module),
      features(module.features) {}